

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::createInstance
          (BeagleCPUImpl<float,_1,_0> *this,int tipCount,int partialsBufferCount,
          int compactBufferCount,int stateCount,int patternCount,int eigenDecompositionCount,
          int matrixCount,int categoryCount,int scaleBufferCount,int resourceNumber,
          int pluginResourceNumber,long preferenceFlags,long requirementFlags)

{
  int iVar1;
  void *pvVar2;
  undefined8 uVar3;
  bad_alloc *this_00;
  int in_ECX;
  int in_EDX;
  int iVar4;
  undefined4 in_ESI;
  long *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000018;
  undefined4 in_stack_00000020;
  ulong in_stack_00000038;
  ulong in_stack_00000040;
  int i_7;
  int sitePartition;
  int i_6;
  int partitionSize;
  int *patternPartitions;
  int partitionCount;
  int hardwareThreads;
  int i_5;
  int i_4;
  int j;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int scaleBufferSize;
  int remainder;
  int modulus;
  bad_alloc *in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff18;
  BeagleCPUImpl<float,_1,_0> *in_stack_ffffffffffffff20;
  long in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  int categoryCount_00;
  long in_stack_ffffffffffffff48;
  EigenDecompositionCube<float,_1> *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  EigenDecompositionSquare<float,_1> *in_stack_ffffffffffffff60;
  int local_70;
  int local_6c;
  int local_68;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  
  categoryCount_00 = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  *(undefined4 *)(in_RDI + 0xc) = 0x800000;
  *(undefined4 *)((long)in_RDI + 100) = 0x14;
  *(int *)((long)in_RDI + 0xc) = in_EDX + in_ECX;
  *(undefined4 *)(in_RDI + 2) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0x24) = in_R8D;
  *(undefined4 *)((long)in_RDI + 0x14) = in_R9D;
  *(undefined4 *)(in_RDI + 9) = 1;
  *(int *)((long)in_RDI + 0x4c) = (int)in_RDI[9];
  *(undefined1 *)(in_RDI + 10) = 0;
  *(undefined1 *)((long)in_RDI + 0x51) = 0;
  *(int *)((long)in_RDI + 0x44) = *(int *)((long)in_RDI + 0xc) - (int)in_RDI[2];
  *(int *)(in_RDI + 5) = *(int *)((long)in_RDI + 0x24) + 1;
  *(undefined4 *)((long)in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x24);
  iVar1 = (**(code **)(*in_RDI + 0x2e0))();
  *(undefined4 *)(in_RDI + 3) = *(undefined4 *)((long)in_RDI + 0x14);
  iVar4 = *(int *)((long)in_RDI + 0x14) % iVar1;
  if (iVar4 != 0) {
    *(int *)(in_RDI + 3) = (iVar1 - iVar4) + (int)in_RDI[3];
  }
  *(int *)((long)in_RDI + 0x1c) = (int)in_RDI[3] - *(int *)((long)in_RDI + 0x14);
  *(undefined4 *)(in_RDI + 4) = in_stack_00000010;
  *(undefined4 *)(in_RDI + 6) = in_stack_00000008;
  *(undefined4 *)((long)in_RDI + 0x34) = in_stack_00000018;
  *(undefined4 *)(in_RDI + 7) = in_stack_00000020;
  *(int *)(in_RDI + 8) = (*(int *)((long)in_RDI + 0x24) + 1) * *(int *)((long)in_RDI + 0x24);
  iVar1 = (int)in_RDI[3];
  in_RDI[0xb] = 0;
  if (((in_stack_00000038 & 0x80) == 0) && ((in_stack_00000040 & 0x80) == 0)) {
    if (((in_stack_00000038 & 0x100) == 0) && ((in_stack_00000040 & 0x100) == 0)) {
      if (((in_stack_00000038 & 0x2000000) == 0) && ((in_stack_00000040 & 0x2000000) == 0)) {
        if (((in_stack_00000038 & 0x400) == 0) && ((in_stack_00000040 & 0x400) == 0)) {
          in_RDI[0xb] = in_RDI[0xb] | 0x40;
          in_RDI[0xb] = in_RDI[0xb] | 0x200;
        }
        else {
          in_RDI[0xb] = in_RDI[0xb] | 0x40;
          in_RDI[0xb] = in_RDI[0xb] | 0x400;
        }
      }
      else {
        in_RDI[0xb] = in_RDI[0xb] | 0x2000000;
        in_RDI[0xb] = in_RDI[0xb] | 0x200;
      }
    }
    else {
      in_RDI[0xb] = in_RDI[0xb] | 0x100;
      in_RDI[0xb] = in_RDI[0xb] | 0x400;
      *(int *)(in_RDI + 7) = *(int *)((long)in_RDI + 0x44) + 1;
    }
  }
  else {
    in_RDI[0xb] = in_RDI[0xb] | 0x80;
    in_RDI[0xb] = in_RDI[0xb] | 0x400;
    *(undefined4 *)(in_RDI + 7) = *(undefined4 *)((long)in_RDI + 0x44);
  }
  if (((in_stack_00000040 & 0x20) == 0) && ((in_stack_00000038 & 0x20) == 0)) {
    in_RDI[0xb] = in_RDI[0xb] | 0x10;
  }
  else {
    in_RDI[0xb] = in_RDI[0xb] | 0x20;
  }
  if (((in_stack_00000040 & 0x200000) == 0) && ((in_stack_00000038 & 0x200000) == 0)) {
    in_RDI[0xb] = in_RDI[0xb] | 0x100000;
  }
  else {
    in_RDI[0xb] = in_RDI[0xb] | 0x200000;
  }
  if (((in_stack_00000040 & 0x40000000) == 0) && ((in_stack_00000038 & 0x40000000) == 0)) {
    in_RDI[0xb] = in_RDI[0xb] | 0x4000;
  }
  else {
    in_RDI[0xb] = in_RDI[0xb] | 0x40000000;
  }
  if ((in_RDI[0xb] & 0x20U) == 0) {
    pvVar2 = operator_new(0x48);
    EigenDecompositionCube<float,_1>::EigenDecompositionCube
              (in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
               (int)in_stack_ffffffffffffff48,categoryCount_00,in_stack_ffffffffffffff38);
    in_RDI[0xd] = (long)pvVar2;
  }
  else {
    pvVar2 = operator_new(0x58);
    EigenDecompositionSquare<float,_1>::EigenDecompositionSquare
              (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
               (int)in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
               in_stack_ffffffffffffff48);
    in_RDI[0xd] = (long)pvVar2;
  }
  pvVar2 = calloc(8,(long)(int)in_RDI[6]);
  in_RDI[0xe] = (long)pvVar2;
  if (in_RDI[0xe] == 0) {
    uVar3 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(in_stack_ffffffffffffff10);
    __cxa_throw(uVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  pvVar2 = malloc((long)*(int *)((long)in_RDI + 0x14) << 3);
  in_RDI[0xf] = (long)pvVar2;
  if (in_RDI[0xf] == 0) {
    uVar3 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(in_stack_ffffffffffffff10);
    __cxa_throw(uVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  *(int *)((long)in_RDI + 0x3c) =
       (int)in_RDI[3] * *(int *)((long)in_RDI + 0x2c) * *(int *)((long)in_RDI + 0x34);
  pvVar2 = malloc((long)*(int *)((long)in_RDI + 0xc) << 3);
  in_RDI[0x15] = (long)pvVar2;
  if (in_RDI[0x15] == 0) {
    uVar3 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(in_stack_ffffffffffffff10);
    __cxa_throw(uVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  pvVar2 = calloc(8,(long)(int)in_RDI[6]);
  in_RDI[0x14] = (long)pvVar2;
  if (in_RDI[0x14] == 0) {
    uVar3 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(in_stack_ffffffffffffff10);
    __cxa_throw(uVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  pvVar2 = calloc(8,(long)(int)in_RDI[6]);
  in_RDI[0x13] = (long)pvVar2;
  if (in_RDI[0x13] == 0) {
    uVar3 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(in_stack_ffffffffffffff10);
    __cxa_throw(uVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  pvVar2 = malloc((long)*(int *)((long)in_RDI + 0xc) << 3);
  in_RDI[0x16] = (long)pvVar2;
  if (in_RDI[0x16] == 0) {
    uVar3 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(in_stack_ffffffffffffff10);
    __cxa_throw(uVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  for (local_38 = 0; local_38 < *(int *)((long)in_RDI + 0xc); local_38 = local_38 + 1) {
    *(undefined8 *)(in_RDI[0x15] + (long)local_38 * 8) = 0;
    *(undefined8 *)(in_RDI[0x16] + (long)local_38 * 8) = 0;
  }
  for (local_3c = (int)in_RDI[2]; local_3c < *(int *)((long)in_RDI + 0xc); local_3c = local_3c + 1)
  {
    pvVar2 = mallocAligned(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    *(void **)(in_RDI[0x15] + (long)local_3c * 8) = pvVar2;
    if (*(long *)(in_RDI[0x15] + (long)local_3c * 8) == 0) {
      uVar3 = __cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(in_stack_ffffffffffffff10);
      __cxa_throw(uVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  in_RDI[0x17] = 0;
  in_RDI[0x18] = 0;
  if ((in_RDI[0xb] & 0x80U) == 0) {
    pvVar2 = malloc((long)(int)in_RDI[7] << 3);
    in_RDI[0x17] = (long)pvVar2;
    if (in_RDI[0x17] == 0) {
      uVar3 = __cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(in_stack_ffffffffffffff10);
      __cxa_throw(uVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    for (local_44 = 0; local_44 < (int)in_RDI[7]; local_44 = local_44 + 1) {
      pvVar2 = malloc((long)iVar1 << 2);
      *(void **)(in_RDI[0x17] + (long)local_44 * 8) = pvVar2;
      if (*(long *)(in_RDI[0x17] + (long)local_44 * 8) == 0) {
        uVar3 = __cxa_allocate_exception(8);
        std::bad_alloc::bad_alloc(in_stack_ffffffffffffff10);
        __cxa_throw(uVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      if ((in_RDI[0xb] & 0x2000000U) != 0) {
        for (local_48 = 0; local_48 < iVar1; local_48 = local_48 + 1) {
          *(undefined4 *)(*(long *)(in_RDI[0x17] + (long)local_44 * 8) + (long)local_48 * 4) =
               0x3f800000;
        }
      }
    }
  }
  else {
    pvVar2 = malloc((long)(int)in_RDI[7] << 3);
    in_RDI[0x18] = (long)pvVar2;
    if (in_RDI[0x18] == 0) {
      uVar3 = __cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(in_stack_ffffffffffffff10);
      __cxa_throw(uVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    for (local_40 = 0; local_40 < (int)in_RDI[7]; local_40 = local_40 + 1) {
      pvVar2 = malloc((long)iVar1 << 1);
      *(void **)(in_RDI[0x18] + (long)local_40 * 8) = pvVar2;
      if (*(long *)(in_RDI[0x18] + (long)local_40 * 8) == 0) {
        uVar3 = __cxa_allocate_exception(8);
        std::bad_alloc::bad_alloc(in_stack_ffffffffffffff10);
        __cxa_throw(uVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
    pvVar2 = malloc((long)*(int *)((long)in_RDI + 0x44) << 2);
    in_RDI[0x19] = (long)pvVar2;
    pvVar2 = malloc(8);
    in_RDI[0x17] = (long)pvVar2;
    pvVar2 = malloc((long)iVar1 << 2);
    *(void **)in_RDI[0x17] = pvVar2;
  }
  pvVar2 = malloc((long)(int)in_RDI[4] << 3);
  in_RDI[0x1a] = (long)pvVar2;
  if (in_RDI[0x1a] != 0) {
    local_4c = 0;
    while( true ) {
      if ((int)in_RDI[4] <= local_4c) {
        pvVar2 = mallocAligned(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        in_RDI[0x1b] = (long)pvVar2;
        pvVar2 = malloc((long)*(int *)((long)in_RDI + 0x14) * 4 *
                        (long)*(int *)((long)in_RDI + 0x24));
        in_RDI[0x1c] = (long)pvVar2;
        pvVar2 = malloc((long)*(int *)((long)in_RDI + 0x14) * 4 *
                        (long)*(int *)((long)in_RDI + 0x24));
        in_RDI[0x1d] = (long)pvVar2;
        pvVar2 = mallocAligned(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        in_RDI[0x1e] = (long)pvVar2;
        pvVar2 = mallocAligned(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        in_RDI[0x1f] = (long)pvVar2;
        in_RDI[0x20] = 0;
        pvVar2 = malloc((long)*(int *)((long)in_RDI + 0x14) * 4 *
                        (long)*(int *)((long)in_RDI + 0x24));
        in_RDI[0x21] = (long)pvVar2;
        pvVar2 = malloc((long)*(int *)((long)in_RDI + 0x14) * 4 *
                        (long)*(int *)((long)in_RDI + 0x24));
        in_RDI[0x22] = (long)pvVar2;
        pvVar2 = malloc((long)*(int *)((long)in_RDI + 0x14) * 4 *
                        (long)*(int *)((long)in_RDI + 0x24));
        in_RDI[0x23] = (long)pvVar2;
        pvVar2 = malloc((long)(int)in_RDI[3] << 2);
        in_RDI[0x25] = (long)pvVar2;
        pvVar2 = malloc((long)(int)in_RDI[3] << 2);
        in_RDI[0x24] = (long)pvVar2;
        for (local_50 = 0; local_50 < (int)in_RDI[3]; local_50 = local_50 + 1) {
          *(undefined4 *)(in_RDI[0x25] + (long)local_50 * 4) = 0;
          *(undefined4 *)(in_RDI[0x24] + (long)local_50 * 4) = 0x3f800000;
        }
        *(undefined1 *)((long)in_RDI + 0x134) = 0;
        *(undefined1 *)((long)in_RDI + 0x135) = 0;
        if ((in_RDI[0xb] & 0x40000000U) != 0) {
          local_54 = std::thread::hardware_concurrency();
          if (*(int *)((long)in_RDI + 0x24) < 5) {
            *(undefined4 *)((long)in_RDI + 0x54) = 0x100;
            if (local_54 < 0x10) {
              *(undefined4 *)((long)in_RDI + 0x54) = 0x300;
            }
            else if (*(int *)((long)in_RDI + 0x14) < 0x40000) {
              local_54 = 0x10;
            }
          }
          else {
            *(undefined4 *)((long)in_RDI + 0x54) = 2;
          }
          if ((*(int *)((long)in_RDI + 0x54) <= *(int *)((long)in_RDI + 0x14)) && (2 < local_54)) {
            local_58 = *(int *)((long)in_RDI + 0x14) / (*(int *)((long)in_RDI + 0x54) / 2);
            if (local_54 / 2 < local_58) {
              local_58 = local_54 / 2;
            }
            pvVar2 = malloc((long)*(int *)((long)in_RDI + 0x14) << 2);
            iVar1 = *(int *)((long)in_RDI + 0x14);
            for (local_68 = 0; local_68 < *(int *)((long)in_RDI + 0x14); local_68 = local_68 + 1) {
              local_6c = local_68 / (iVar1 / local_58);
              if (local_58 + -1 < local_6c) {
                local_6c = local_58 + -1;
              }
              *(int *)((long)pvVar2 + (long)local_68 * 4) = local_6c;
            }
            (**(code **)(*in_RDI + 0x70))(in_RDI,local_58,pvVar2);
            pvVar2 = malloc((long)*(int *)((long)in_RDI + 0xc) * 4 * (long)(int)in_RDI[9] * 9);
            in_RDI[0x2a] = (long)pvVar2;
            if (*(int *)((long)in_RDI + 0x54) * 4 <= *(int *)((long)in_RDI + 0x14)) {
              pvVar2 = malloc((long)local_58 << 2);
              in_RDI[0x2b] = (long)pvVar2;
              for (local_70 = 0; local_70 < local_58; local_70 = local_70 + 1) {
                *(int *)(in_RDI[0x2b] + (long)local_70 * 4) = local_70;
              }
              pvVar2 = malloc((long)local_58 << 3);
              in_RDI[0x2c] = (long)pvVar2;
              *(undefined1 *)((long)in_RDI + 0x136) = 0;
            }
            *(undefined1 *)((long)in_RDI + 0x135) = 0;
          }
        }
        return 0;
      }
      pvVar2 = mallocAligned(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      *(void **)(in_RDI[0x1a] + (long)local_4c * 8) = pvVar2;
      if (*(long *)(in_RDI[0x1a] + (long)local_4c * 8) == 0) break;
      local_4c = local_4c + 1;
    }
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  uVar3 = __cxa_allocate_exception(8);
  std::bad_alloc::bad_alloc(in_stack_ffffffffffffff10);
  __cxa_throw(uVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::createInstance(int tipCount,
                                  int partialsBufferCount,
                                  int compactBufferCount,
                                  int stateCount,
                                  int patternCount,
                                  int eigenDecompositionCount,
                                  int matrixCount,
                                  int categoryCount,
                                  int scaleBufferCount,
                                  int resourceNumber,
                                  int pluginResourceNumber,
                                  long preferenceFlags,
                                  long requirementFlags) {
    if (DEBUGGING_OUTPUT)
        std::cerr << "in BeagleCPUImpl::initialize\n" ;

    if (DOUBLE_PRECISION) {
        realtypeMin = DBL_MIN;
        scalingExponentThreshold = 200;
    } else {
        realtypeMin = FLT_MIN;
        scalingExponentThreshold = 20;
    }

    kBufferCount = partialsBufferCount + compactBufferCount;
    kTipCount = tipCount;
    assert(kBufferCount > kTipCount);
    kStateCount = stateCount;
    kPatternCount = patternCount;

    kPartitionCount = 1;
    kMaxPartitionCount = kPartitionCount;
    kPartitionsInitialised = false;
    kPatternsReordered = false;

    kInternalPartialsBufferCount = kBufferCount - kTipCount;

    kTransPaddedStateCount = kStateCount + T_PAD;
    kPartialsPaddedStateCount = kStateCount + P_PAD;

    // Handle possible padding of pattern sites for vectorization
    int modulus = getPaddedPatternsModulus();
    kPaddedPatternCount = kPatternCount;
    int remainder = kPatternCount % modulus;
    if (remainder != 0) {
        kPaddedPatternCount += modulus - remainder;
    }
    kExtraPatterns = kPaddedPatternCount - kPatternCount;

    kMatrixCount = matrixCount;
    kEigenDecompCount = eigenDecompositionCount;
    kCategoryCount = categoryCount;
    kScaleBufferCount = scaleBufferCount;

    kMatrixSize = (T_PAD + kStateCount) * kStateCount;

    int scaleBufferSize = kPaddedPatternCount;

    kFlags = 0;

    if (preferenceFlags & BEAGLE_FLAG_SCALING_AUTO || requirementFlags & BEAGLE_FLAG_SCALING_AUTO) {
        kFlags |= BEAGLE_FLAG_SCALING_AUTO;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
        kScaleBufferCount = kInternalPartialsBufferCount;
    } else if (preferenceFlags & BEAGLE_FLAG_SCALING_ALWAYS || requirementFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
        kFlags |= BEAGLE_FLAG_SCALING_ALWAYS;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
        kScaleBufferCount = kInternalPartialsBufferCount + 1; // +1 for temp buffer used by edgelikelihood
    } else if (preferenceFlags & BEAGLE_FLAG_SCALING_DYNAMIC || requirementFlags & BEAGLE_FLAG_SCALING_DYNAMIC) {
        kFlags |= BEAGLE_FLAG_SCALING_DYNAMIC;
        kFlags |= BEAGLE_FLAG_SCALERS_RAW;
    } else if (preferenceFlags & BEAGLE_FLAG_SCALERS_LOG || requirementFlags & BEAGLE_FLAG_SCALERS_LOG) {
        kFlags |= BEAGLE_FLAG_SCALING_MANUAL;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
    } else {
        kFlags |= BEAGLE_FLAG_SCALING_MANUAL;
        kFlags |= BEAGLE_FLAG_SCALERS_RAW;
    }

    if (requirementFlags & BEAGLE_FLAG_EIGEN_COMPLEX || preferenceFlags & BEAGLE_FLAG_EIGEN_COMPLEX)
        kFlags |= BEAGLE_FLAG_EIGEN_COMPLEX;
    else
        kFlags |= BEAGLE_FLAG_EIGEN_REAL;

    if (requirementFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED || preferenceFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED)
        kFlags |= BEAGLE_FLAG_INVEVEC_TRANSPOSED;
    else
        kFlags |= BEAGLE_FLAG_INVEVEC_STANDARD;

    if (requirementFlags & BEAGLE_FLAG_THREADING_CPP || preferenceFlags & BEAGLE_FLAG_THREADING_CPP)
        kFlags |= BEAGLE_FLAG_THREADING_CPP;
    else
        kFlags |= BEAGLE_FLAG_THREADING_NONE;

    if (kFlags & BEAGLE_FLAG_EIGEN_COMPLEX)
        gEigenDecomposition = new EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>(kEigenDecompCount,
                kStateCount,kCategoryCount,kFlags);
    else
        gEigenDecomposition = new EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>(kEigenDecompCount,
                kStateCount, kCategoryCount,kFlags);

    gCategoryRates = (double**) calloc(sizeof(double), kEigenDecompCount);
    if (gCategoryRates == NULL)
        throw std::bad_alloc();

    gPatternWeights = (double*) malloc(sizeof(double) * kPatternCount);
    if (gPatternWeights == NULL)
        throw std::bad_alloc();

    // TODO: if pattern padding is implemented this will create problems with setTipPartials
    kPartialsSize = kPaddedPatternCount * kPartialsPaddedStateCount * kCategoryCount;

    gPartials = (REALTYPE**) malloc(sizeof(REALTYPE*) * kBufferCount);
    if (gPartials == NULL)
     throw std::bad_alloc();

    gStateFrequencies = (REALTYPE**) calloc(sizeof(REALTYPE*), kEigenDecompCount);
    if (gStateFrequencies == NULL)
        throw std::bad_alloc();

    gCategoryWeights = (REALTYPE**) calloc(sizeof(REALTYPE*), kEigenDecompCount);
    if (gCategoryWeights == NULL)
        throw std::bad_alloc();

    // assigning kBufferCount to this array so that we can just check if a tipStateBuffer is
    // allocated
    gTipStates = (int**) malloc(sizeof(int*) * kBufferCount);
    if (gTipStates == NULL)
        throw std::bad_alloc();

    for (int i = 0; i < kBufferCount; i++) {
        gPartials[i] = NULL;
        gTipStates[i] = NULL;
    }

    for (int i = kTipCount; i < kBufferCount; i++) {
        gPartials[i] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
        if (gPartials[i] == NULL)
            throw std::bad_alloc();
    }

    gScaleBuffers = NULL;

    gAutoScaleBuffers = NULL;

    if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
        gAutoScaleBuffers = (signed short**) malloc(sizeof(signed short*) * kScaleBufferCount);
        if (gAutoScaleBuffers == NULL)
            throw std::bad_alloc();
        for (int i = 0; i < kScaleBufferCount; i++) {
            gAutoScaleBuffers[i] = (signed short*) malloc(sizeof(signed short) * scaleBufferSize);
            if (gAutoScaleBuffers[i] == 0L)
                throw std::bad_alloc();
        }
        gActiveScalingFactors = (int*) malloc(sizeof(int) * kInternalPartialsBufferCount);
        gScaleBuffers = (REALTYPE**) malloc(sizeof(REALTYPE*));
        gScaleBuffers[0] = (REALTYPE*) malloc(sizeof(REALTYPE) * scaleBufferSize);
    } else {
        gScaleBuffers = (REALTYPE**) malloc(sizeof(REALTYPE*) * kScaleBufferCount);
        if (gScaleBuffers == NULL)
            throw std::bad_alloc();

        for (int i = 0; i < kScaleBufferCount; i++) {
            gScaleBuffers[i] = (REALTYPE*) malloc(sizeof(REALTYPE) * scaleBufferSize);

            if (gScaleBuffers[i] == 0L)
                throw std::bad_alloc();


            if (kFlags & BEAGLE_FLAG_SCALING_DYNAMIC) {
                for (int j=0; j < scaleBufferSize; j++) {
                    gScaleBuffers[i][j] = 1.0;
                }
            }
        }
    }


    gTransitionMatrices = (REALTYPE**) malloc(sizeof(REALTYPE*) * kMatrixCount);
    if (gTransitionMatrices == NULL)
        throw std::bad_alloc();
    for (int i = 0; i < kMatrixCount; i++) {
        gTransitionMatrices[i] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kMatrixSize * kCategoryCount);
        if (gTransitionMatrices[i] == 0L)
            throw std::bad_alloc();
    }

    integrationTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount * kStateCount);
    firstDerivTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    secondDerivTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);

//    cLikelihoodTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount * kCategoryCount);
    grandDenominatorDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPaddedPatternCount); // TODO Deprecate in favor of integrationTmp
    grandNumeratorDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPaddedPatternCount);
    crossProductNumeratorTmp = nullptr;
//    grandNumeratorLowerBoundDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount);
//    grandNumeratorUpperBoundDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount);

    outLogLikelihoodsTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    outFirstDerivativesTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    outSecondDerivativesTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);

    zeros = (REALTYPE*) malloc(sizeof(REALTYPE) * kPaddedPatternCount);
    ones = (REALTYPE*) malloc(sizeof(REALTYPE) * kPaddedPatternCount);
    for(int i = 0; i < kPaddedPatternCount; i++) {
        zeros[i] = 0.0;
        ones[i] = 1.0;
    }

    kThreadingEnabled = false;
    kAutoPartitioningEnabled = false;
    if (kFlags & BEAGLE_FLAG_THREADING_CPP) {
        int hardwareThreads = std::thread::hardware_concurrency();
        if (kStateCount <= 4) {
            kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_LOW;
            if (hardwareThreads < BEAGLE_CPU_ASYNC_HW_THREAD_COUNT_THRESHOLD) {
                kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_HIGH;
            } else if (kPatternCount < BEAGLE_CPU_ASYNC_LIMIT_PATTERN_COUNT) {
                hardwareThreads = BEAGLE_CPU_ASYNC_HW_THREAD_COUNT_THRESHOLD;
            }
        } else {
            // todo: assess minimum pattern count for efficient auto-threading
            //       for higher state-count values
            kMinPatternCount = 2;
        }
        if (kPatternCount >= kMinPatternCount && hardwareThreads > 2) {
            int partitionCount = kPatternCount/(kMinPatternCount/2);
            if (partitionCount > hardwareThreads/2) {
                partitionCount = hardwareThreads/2;
            }
            int* patternPartitions = (int*) malloc(sizeof(int) * kPatternCount);
            int partitionSize = kPatternCount/partitionCount;
            for (int i=0; i<kPatternCount; i++) {
                int sitePartition = i/partitionSize;
                if (sitePartition > partitionCount - 1)
                    sitePartition = partitionCount - 1;
                patternPartitions[i] = sitePartition;
            }
            setPatternPartitions(partitionCount, patternPartitions);

            gAutoPartitionOperations = (int*) malloc(sizeof(int) * kBufferCount * kPartitionCount * BEAGLE_PARTITION_OP_COUNT);

            if (kPatternCount >= kMinPatternCount*4) {
                gAutoPartitionIndices = (int*) malloc(sizeof(int) * partitionCount);
                for (int i=0; i<partitionCount; i++) {
                    gAutoPartitionIndices[i] = i;
                }
                gAutoPartitionOutSumLogLikelihoods = (double*) malloc(sizeof(double) * partitionCount);
                kAutoRootPartitioningEnabled = false; //TODO: XJ: need to change this back to true
            }
            // TODO: XJ: need to change below back to true
            kAutoPartitioningEnabled = false;
        }
    }

    return BEAGLE_SUCCESS;
}